

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O0

Abc_Cex_t * Pdr_ManDeriveCexAbs(Pdr_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Abc_Cex_t *pAVar7;
  Gia_Man_t *p_00;
  Abc_Cex_t *p_01;
  int local_54;
  int iPPI;
  int nFfRefined;
  int nPis;
  int nFrames;
  int Flop;
  int Lit;
  int f;
  int i;
  Pdr_Obl_t *pObl;
  Abc_Cex_t *pCexCare;
  Abc_Cex_t *pCex;
  Gia_Man_t *pAbs;
  Pdr_Man_t *p_local;
  
  nFfRefined = 0;
  iVar2 = Saig_ManPiNum(p->pAig);
  local_54 = 0;
  if ((p->pPars->fUseAbs == 0) || (p->vMapPpi2Ff == (Vec_Int_t *)0x0)) {
    p_local = (Pdr_Man_t *)Pdr_ManDeriveCex(p);
  }
  else {
    for (Lit = 0; iVar3 = Vec_IntSize(p->vMapPpi2Ff), Lit < iVar3; Lit = Lit + 1) {
      iVar3 = Vec_IntEntry(p->vMapPpi2Ff,Lit);
      iVar4 = Vec_IntEntry(p->vMapFf2Ppi,iVar3);
      if (iVar4 != Lit) {
        __assert_fail("Vec_IntEntry( p->vMapFf2Ppi, Flop ) == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                      ,0x1cf,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
      }
      Vec_IntWriteEntry(p->vMapFf2Ppi,iVar3,-1);
    }
    Vec_IntClear(p->vMapPpi2Ff);
    for (_f = p->pQueue; _f != (Pdr_Obl_t *)0x0; _f = _f->pNext) {
      for (Lit = _f->pState->nLits; Lit < _f->pState->nTotal; Lit = Lit + 1) {
        iVar3 = *(int *)(&_f->pState->field_0x14 + (long)Lit * 4);
        iVar4 = Abc_Lit2Var(iVar3);
        if (iVar2 <= iVar4) {
          iVar3 = Abc_Lit2Var(iVar3);
          iVar3 = iVar3 - iVar2;
          iVar4 = Vec_IntEntry(p->vMapFf2Ppi,iVar3);
          if (iVar4 < 0) {
            pVVar1 = p->vMapFf2Ppi;
            iVar4 = Vec_IntSize(p->vMapPpi2Ff);
            Vec_IntWriteEntry(pVVar1,iVar3,iVar4);
            Vec_IntPush(p->vMapPpi2Ff,iVar3);
          }
        }
      }
      nFfRefined = nFfRefined + 1;
    }
    iVar3 = Vec_IntSize(p->vMapPpi2Ff);
    if (iVar3 == 0) {
      p_local = (Pdr_Man_t *)Pdr_ManDeriveCex(p);
    }
    else {
      if (p->pPars->fUseSimpleRef == 0) {
        iVar3 = Aig_ManRegNum(p->pAig);
        iVar4 = Vec_IntSize(p->vMapPpi2Ff);
        iVar5 = Saig_ManPiNum(p->pAig);
        iVar6 = Vec_IntSize(p->vMapPpi2Ff);
        pAVar7 = Abc_CexAlloc(iVar3 - iVar4,iVar5 + iVar6,nFfRefined);
        pAVar7->iPo = p->iOutCur;
        pAVar7->iFrame = nFfRefined + -1;
        _f = p->pQueue;
        Flop = 0;
        for (; _f != (Pdr_Obl_t *)0x0; _f = _f->pNext) {
          for (Lit = _f->pState->nLits; Lit < _f->pState->nTotal; Lit = Lit + 1) {
            iVar3 = *(int *)(&_f->pState->field_0x14 + (long)Lit * 4);
            iVar4 = Abc_LitIsCompl(iVar3);
            if (iVar4 == 0) {
              iVar4 = Abc_Lit2Var(iVar3);
              if (iVar4 < iVar2) {
                iVar4 = pAVar7->nRegs;
                iVar5 = pAVar7->nPis;
                iVar3 = Abc_Lit2Var(iVar3);
                Abc_InfoSetBit((uint *)(pAVar7 + 1),iVar4 + Flop * iVar5 + iVar3);
              }
              else {
                pVVar1 = p->vMapFf2Ppi;
                iVar3 = Abc_Lit2Var(iVar3);
                iVar3 = Vec_IntEntry(pVVar1,iVar3 - iVar2);
                if (pAVar7->nPis <= iVar2 + iVar3) {
                  __assert_fail("iPPI < pCex->nPis",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                                ,0x200,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
                }
                Abc_InfoSetBit((uint *)(pAVar7 + 1),
                               pAVar7->nRegs + Flop * pAVar7->nPis + iVar2 + iVar3);
              }
            }
          }
          Flop = Flop + 1;
        }
        if (Flop != nFfRefined) {
          __assert_fail("f == nFrames",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                        ,0x204,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
        }
        p_00 = Gia_ManDupAbs(p->pGia,p->vMapPpi2Ff,p->vMapFf2Ppi);
        p_01 = Bmc_CexCareMinimizeAig(p_00,iVar2,pAVar7,1,0,0);
        Gia_ManStop(p_00);
        if (p_01->nPis != pAVar7->nPis) {
          __assert_fail("pCexCare->nPis == pCex->nPis",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                        ,0x209,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
        }
        Abc_CexFree(pAVar7);
        for (Flop = 0; Lit = iVar2, Flop < nFfRefined; Flop = Flop + 1) {
          for (; Lit < p_01->nPis; Lit = Lit + 1) {
            iVar3 = Abc_InfoHasBit((uint *)(p_01 + 1),p_01->nRegs + p_01->nPis * Flop + Lit);
            if (iVar3 != 0) {
              pVVar1 = p->vAbsFlops;
              iVar3 = Vec_IntEntry(p->vMapPpi2Ff,Lit - iVar2);
              iVar3 = Vec_IntEntry(pVVar1,iVar3);
              if (iVar3 == 0) {
                pVVar1 = p->vAbsFlops;
                iVar3 = Vec_IntEntry(p->vMapPpi2Ff,Lit - iVar2);
                Vec_IntWriteEntry(pVVar1,iVar3,1);
                local_54 = local_54 + 1;
              }
            }
          }
        }
        Abc_CexFree(p_01);
        if (local_54 == 0) {
          pAVar7 = Pdr_ManDeriveCex(p);
          return pAVar7;
        }
      }
      else {
        for (Lit = 0; iVar2 = Vec_IntSize(p->vMapPpi2Ff), Lit < iVar2; Lit = Lit + 1) {
          iVar2 = Vec_IntEntry(p->vMapPpi2Ff,Lit);
          iVar3 = Vec_IntEntry(p->vAbsFlops,iVar2);
          if (iVar3 != 0) {
            __assert_fail("Vec_IntEntry(p->vAbsFlops, Flop) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                          ,0x1ea,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
          }
          Vec_IntWriteEntry(p->vAbsFlops,iVar2,1);
        }
      }
      p->nCexesTotal = p->nCexesTotal + 1;
      p->nCexes = p->nCexes + 1;
      p_local = (Pdr_Man_t *)0x0;
    }
  }
  return (Abc_Cex_t *)p_local;
}

Assistant:

Abc_Cex_t * Pdr_ManDeriveCexAbs( Pdr_Man_t * p )
{
    extern Gia_Man_t * Gia_ManDupAbs( Gia_Man_t * p, Vec_Int_t * vMapPpi2Ff, Vec_Int_t * vMapFf2Ppi );

    Gia_Man_t * pAbs;
    Abc_Cex_t * pCex, * pCexCare;
    Pdr_Obl_t * pObl;
    int i, f, Lit, Flop, nFrames = 0;
    int nPis = Saig_ManPiNum(p->pAig);
    int nFfRefined = 0;
    if ( !p->pPars->fUseAbs || !p->vMapPpi2Ff )
        return Pdr_ManDeriveCex(p);
    // restore previous map
    Vec_IntForEachEntry( p->vMapPpi2Ff, Flop, i )
    {
        assert( Vec_IntEntry( p->vMapFf2Ppi, Flop ) == i );
        Vec_IntWriteEntry( p->vMapFf2Ppi, Flop, -1 );
    }
    Vec_IntClear( p->vMapPpi2Ff );
    // count the number of frames
    for ( pObl = p->pQueue; pObl; pObl = pObl->pNext )
    {
        for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
        {
            Lit = pObl->pState->Lits[i]; 
            if ( Abc_Lit2Var(Lit) < nPis ) // PI literal
                continue;
            Flop = Abc_Lit2Var(Lit) - nPis;
            if ( Vec_IntEntry(p->vMapFf2Ppi, Flop) >= 0 ) // already used PPI literal
                continue;
            Vec_IntWriteEntry( p->vMapFf2Ppi, Flop, Vec_IntSize(p->vMapPpi2Ff) );
            Vec_IntPush( p->vMapPpi2Ff, Flop );
        }
        nFrames++;
    }
    if ( Vec_IntSize(p->vMapPpi2Ff) == 0 ) // no PPIs -- this is a real CEX
        return Pdr_ManDeriveCex(p);
    if ( p->pPars->fUseSimpleRef )
    {
        // rely on ternary simulation to perform refinement
        Vec_IntForEachEntry( p->vMapPpi2Ff, Flop, i )
        {
            assert( Vec_IntEntry(p->vAbsFlops, Flop) == 0 );
            Vec_IntWriteEntry( p->vAbsFlops, Flop, 1 );
            nFfRefined++;
        }
    }
    else
    {
        // create the counter-example
        pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig) - Vec_IntSize(p->vMapPpi2Ff), Saig_ManPiNum(p->pAig) + Vec_IntSize(p->vMapPpi2Ff), nFrames );
        pCex->iPo    = p->iOutCur;
        pCex->iFrame = nFrames-1;
        for ( pObl = p->pQueue, f = 0; pObl; pObl = pObl->pNext, f++ )
            for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
            {
                Lit = pObl->pState->Lits[i];
                if ( Abc_LitIsCompl(Lit) )
                    continue;
                if ( Abc_Lit2Var(Lit) < nPis ) // PI literal
                    Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Abc_Lit2Var(Lit) );
                else
                {
                    int iPPI = nPis + Vec_IntEntry(p->vMapFf2Ppi, Abc_Lit2Var(Lit) - nPis);
                    assert( iPPI < pCex->nPis );
                    Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + iPPI );
                }
            }
        assert( f == nFrames );
        // perform CEX minimization
        pAbs = Gia_ManDupAbs( p->pGia, p->vMapPpi2Ff, p->vMapFf2Ppi );
        pCexCare = Bmc_CexCareMinimizeAig( pAbs, nPis, pCex, 1, 0, 0 );
        Gia_ManStop( pAbs );
        assert( pCexCare->nPis == pCex->nPis );
        Abc_CexFree( pCex );
        // detect care PPIs
        for ( f = 0; f < nFrames; f++ )
        {
            for ( i = nPis; i < pCexCare->nPis; i++ )
                if ( Abc_InfoHasBit(pCexCare->pData, pCexCare->nRegs + pCexCare->nPis * f + i) )
                {
                    if ( Vec_IntEntry(p->vAbsFlops, Vec_IntEntry(p->vMapPpi2Ff, i-nPis)) == 0 ) // currently abstracted
                        Vec_IntWriteEntry( p->vAbsFlops, Vec_IntEntry(p->vMapPpi2Ff, i-nPis), 1 ), nFfRefined++;
                }
        }
        Abc_CexFree( pCexCare );
        if ( nFfRefined == 0 ) // no refinement -- this is a real CEX
            return Pdr_ManDeriveCex(p);
    }
    //printf( "CEX-based refinement refined %d flops.\n", nFfRefined );
    p->nCexesTotal++;
    p->nCexes++;
    return NULL;
}